

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::SimpleTransformPromiseNode<void,_Func_&>,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1884::run()::Func&>,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1884::run()::Func&,void*&>
          (PromiseDisposer *this,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
          Func *params_1,void **params_2)

{
  void *pvVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_00;
  Func *params_1_00;
  void **params_2_00;
  PromiseArena *arena;
  SimpleTransformPromiseNode<void,_Func_&> *ptr;
  void **params_local_2;
  Func *params_local_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(params);
  params_1_00 = fwd<kj::(anonymous_namespace)::TestCase1884::run()::Func&>(params_1);
  params_2_00 = fwd<void*&>(params_2);
  ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1884::run()::Func&>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1884::run()::Func&,void*&>
            ((SimpleTransformPromiseNode<void,_Func_&> *)((long)pvVar1 + 0x3d8),params_00,
             params_1_00,params_2_00);
  *(void **)((long)pvVar1 + 0x3e0) = pvVar1;
  Own<kj::_::SimpleTransformPromiseNode<void,_Func_&>,_kj::_::PromiseDisposer>::Own
            ((Own<kj::_::SimpleTransformPromiseNode<void,_Func_&>,_kj::_::PromiseDisposer> *)this,
             (SimpleTransformPromiseNode<void,_Func_&> *)((long)pvVar1 + 0x3d8));
  return (Own<kj::_::SimpleTransformPromiseNode<void,_Func_&>,_kj::_::PromiseDisposer>)
         (SimpleTransformPromiseNode<void,_Func_&> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }